

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O3

wchar_t get_patched_distance(pfdistances_patched *distances,loc_conflict grid)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  
  if (((((long)grid < 0) || (wVar4 = grid.x, wVar4 < L'\0')) ||
      (wVar1 = grid.y, distances->height <= wVar1)) || (distances->width <= wVar4)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2f6,"int get_patched_distance(const struct pfdistances_patched *, struct loc)")
    ;
  }
  bVar2 = (byte)distances->patch_shift;
  wVar3 = (uint)wVar1 >> (bVar2 & 0x1f);
  if (distances->npatchy <= wVar3) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2f8,"int get_patched_distance(const struct pfdistances_patched *, struct loc)")
    ;
  }
  wVar6 = (uint)wVar4 >> (bVar2 & 0x1f);
  if (wVar6 < distances->npatchx) {
    if (distances->patches[(uint)wVar3][(uint)wVar6] == (int *)0x0) {
      __assert_fail("distances->patches[patchy][patchx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                    ,0x2fb,
                    "int get_patched_distance(const struct pfdistances_patched *, struct loc)");
    }
    uVar5 = (wVar4 & distances->patch_mask) + ((wVar1 & distances->patch_mask) << (bVar2 & 0x1f));
    if ((-1 < (int)uVar5) && ((int)uVar5 < distances->patch_size * distances->patch_size)) {
      return distances->patches[(uint)wVar3][(uint)wVar6][uVar5];
    }
    __assert_fail("patchi >= 0 && patchi < distances->patch_size * distances->patch_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2ff,"int get_patched_distance(const struct pfdistances_patched *, struct loc)")
    ;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                ,0x2fa,"int get_patched_distance(const struct pfdistances_patched *, struct loc)");
}

Assistant:

static int get_patched_distance(const struct pfdistances_patched *distances,
		struct loc grid)
{
	int patchy, patchx, patchi;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	assert(distances->patches[patchy][patchx]);
	patchi = ((grid.y & distances->patch_mask) << distances->patch_shift)
		+ (grid.x & distances->patch_mask);
	assert(patchi >= 0 && patchi < distances->patch_size
		* distances->patch_size);
	return distances->patches[patchy][patchx][patchi];
}